

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_deleted_doc_right_before_the_end_test(void)

{
  fdb_status fVar1;
  uint uVar2;
  char *__format;
  fdb_iterator *fit;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char keybuf [256];
  fdb_kvs_config local_350;
  char cmd [256];
  fdb_config local_230;
  char valuebuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  local_230.buffercache_size = 0;
  fdb_get_default_kvs_config();
  sprintf(cmd,"rm -rf  %s*","./dummy");
  system(cmd);
  fdb_open(&dbfile,"./dummy",&local_230);
  fdb_kvs_open(dbfile,&db,(char *)0x0,&local_350);
  for (uVar2 = 0; uVar2 != 3; uVar2 = uVar2 + 1) {
    sprintf(keybuf,"k%06d\n",(ulong)uVar2);
    sprintf(valuebuf,"v%06d\n",(ulong)uVar2);
    fdb_set_kv(db,keybuf,8,valuebuf,8);
  }
  sprintf(keybuf,"k%06d\n",1);
  fdb_del_kv(db,keybuf,8);
  fdb_commit(dbfile,'\0');
  keybuf[0] = 'a';
  keybuf[1] = '\0';
  cmd[0] = 'z';
  cmd[1] = '\0';
  fVar1 = fdb_iterator_init(db,&fit,keybuf,1,cmd,1,2);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf6d);
    iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf6d,"void iterator_deleted_doc_right_before_the_end_test()");
  }
  fVar1 = fdb_iterator_seek_to_max(fit);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf70);
    iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf70,"void iterator_deleted_doc_right_before_the_end_test()");
  }
  rdoc = (fdb_doc *)0x0;
  fVar1 = fdb_iterator_get(fit,&rdoc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf74);
    iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf74,"void iterator_deleted_doc_right_before_the_end_test()");
  }
  sprintf(keybuf,"k%06d\n",2);
  if (*rdoc->key != CONCAT62(keybuf._2_6_,keybuf._0_2_)) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",keybuf,rdoc->key,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf77);
    iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf77,"void iterator_deleted_doc_right_before_the_end_test()");
  }
  fdb_doc_free(rdoc);
  fVar1 = fdb_iterator_prev(fit);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf7b);
    iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf7b,"void iterator_deleted_doc_right_before_the_end_test()");
  }
  rdoc = (fdb_doc *)0x0;
  fVar1 = fdb_iterator_get(fit,&rdoc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf7f);
    iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf7f,"void iterator_deleted_doc_right_before_the_end_test()");
  }
  sprintf(keybuf,"k%06d\n",0);
  if (*rdoc->key == CONCAT62(keybuf._2_6_,keybuf._0_2_)) {
    fdb_doc_free(rdoc);
    fdb_iterator_close(fit);
    fVar1 = fdb_iterator_init(db,&fit,keybuf,1,cmd,1,2);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xf89);
      iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf89,"void iterator_deleted_doc_right_before_the_end_test()");
    }
    fVar1 = fdb_iterator_seek_to_min(fit);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xf8c);
      iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf8c,"void iterator_deleted_doc_right_before_the_end_test()");
    }
    rdoc = (fdb_doc *)0x0;
    fVar1 = fdb_iterator_get(fit,&rdoc);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xf90);
      iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf90,"void iterator_deleted_doc_right_before_the_end_test()");
    }
    sprintf(keybuf,"k%06d\n",0);
    if (*rdoc->key == CONCAT62(keybuf._2_6_,keybuf._0_2_)) {
      fdb_doc_free(rdoc);
      fVar1 = fdb_iterator_next(fit);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xf97);
        iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xf97,"void iterator_deleted_doc_right_before_the_end_test()");
      }
      rdoc = (fdb_doc *)0x0;
      fVar1 = fdb_iterator_get(fit,&rdoc);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        sprintf(keybuf,"k%06d\n",2);
        if (*rdoc->key == CONCAT62(keybuf._2_6_,keybuf._0_2_)) {
          fdb_doc_free(rdoc);
          fdb_iterator_close(fit);
          fdb_close(dbfile);
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"iterator deleted doc right before the end of iteration test");
          return;
        }
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",keybuf,rdoc->key,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xf9e);
        iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xf9e,"void iterator_deleted_doc_right_before_the_end_test()");
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xf9b);
      iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf9b,"void iterator_deleted_doc_right_before_the_end_test()");
    }
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",keybuf,rdoc->key,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf93);
    iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf93,"void iterator_deleted_doc_right_before_the_end_test()");
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",keybuf,rdoc->key,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0xf82);
  iterator_deleted_doc_right_before_the_end_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xf82,"void iterator_deleted_doc_right_before_the_end_test()");
}

Assistant:

void iterator_deleted_doc_right_before_the_end_test()
{
    TEST_INIT();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_iterator *fit;
    fdb_doc *rdoc;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[256], cmd[256];

    memleak_start();

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    kvs_config = fdb_get_default_kvs_config();

    sprintf(cmd, SHELL_DEL " %s*", "./dummy");
    r = system(cmd); (void)r;

    fdb_open(&dbfile, "./dummy", &config);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);

    // insert 3 docs
    for (i=0;i<3;++i) {
        sprintf(keybuf, "k%06d\n", i);
        sprintf(valuebuf, "v%06d\n", i);
        fdb_set_kv(db, keybuf, 8, valuebuf, 8);
    }

    // delete the middle doc
    i = 1;
    sprintf(keybuf, "k%06d\n", i);
    fdb_del_kv(db, keybuf, 8);

    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    sprintf(keybuf, "a");
    sprintf(cmd, "z");
    s = fdb_iterator_init(db, &fit, keybuf, 1, cmd, 1, FDB_ITR_NO_DELETES);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 2;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    s = fdb_iterator_prev(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    fdb_iterator_close(fit);

    // opposite case
    s = fdb_iterator_init(db, &fit, keybuf, 1, cmd, 1, FDB_ITR_NO_DELETES);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_iterator_seek_to_min(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    s = fdb_iterator_next(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 2;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    fdb_iterator_close(fit);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator deleted doc right before the end of iteration test");
}